

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * __thiscall cxxopts::Options::help_one_group(Options *this,string *g)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  unsigned_long *puVar4;
  size_t start;
  iterator width;
  pointer ppVar5;
  size_t sVar6;
  String *in_RDI;
  String d;
  HelpOptionDetails *o_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1_1;
  iterator fiter;
  size_t allowed;
  String s;
  HelpOptionDetails *o;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1;
  size_t longest;
  OptionHelp format;
  const_iterator group;
  String *result;
  value_type *in_stack_fffffffffffffce8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  allocator *paVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  bool local_2a1;
  allocator local_271;
  string local_270 [32];
  undefined1 local_250 [40];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1c8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1c0;
  reference local_1b8;
  HelpOptionDetails *local_1b0;
  __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
  in_stack_fffffffffffffe58;
  HelpOptionDetails *o_00;
  string local_180 [96];
  size_t local_120;
  string local_118 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  reference local_e8;
  HelpOptionDetails *local_e0;
  __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
  local_d8;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *local_d0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [39];
  undefined1 local_61;
  unsigned_long local_60 [6];
  allocator local_29;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
               *)in_stack_fffffffffffffce8,(key_type *)0x1e3866);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
              *)in_stack_fffffffffffffce8);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1e391d);
    local_60[0] = 0;
    local_61 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                     in_stack_fffffffffffffd30);
      std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
      toLocalString<std::__cxx11::string>(&in_stack_fffffffffffffce8->first);
      std::__cxx11::string::operator+=((string *)in_RDI,local_88);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
                           *)0x1e3a62);
    local_d0 = &(ppVar3->second).options;
    local_d8._M_current =
         (HelpOptionDetails *)
         std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::begin
                   ((vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
                     *)in_stack_fffffffffffffce8);
    local_e0 = (HelpOptionDetails *)
               std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
               ::end((vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
                      *)in_stack_fffffffffffffce8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)in_stack_fffffffffffffcf0,
                              (__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)in_stack_fffffffffffffce8), bVar1) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                 ::operator*(&local_d8);
      local_2a1 = false;
      if ((local_e8->is_container & 1U) != 0) {
        local_f0._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffce8,(key_type *)0x1e3b06);
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffce8);
        local_2a1 = std::__detail::operator!=(&local_f0,&local_f8);
      }
      if (local_2a1 == false) {
        (anonymous_namespace)::format_option_abi_cxx11_(in_stack_fffffffffffffe58._M_current);
        local_120 = stringLength((String *)0x1e3b82);
        puVar4 = std::max<unsigned_long>(local_60,&local_120);
        local_60[0] = *puVar4;
        std::__cxx11::string::string(local_180);
        std::make_pair<std::__cxx11::string&,std::__cxx11::string>
                  (in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->first);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffcf0);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string(local_118);
      }
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++(&local_d8);
    }
    o_00 = (HelpOptionDetails *)0x1e;
    puVar4 = std::min<unsigned_long>(local_60,(unsigned_long *)&stack0xfffffffffffffe78);
    local_60[0] = *puVar4;
    start = 0x4a - local_60[0];
    width = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffce8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
                  *)0x1e3d07);
    std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::begin
              ((vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *)
               in_stack_fffffffffffffce8);
    local_1b0 = (HelpOptionDetails *)
                std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
                ::end((vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
                       *)in_stack_fffffffffffffce8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)in_stack_fffffffffffffcf0,
                              (__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)in_stack_fffffffffffffce8), bVar1) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                  ::operator*((__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)&stack0xfffffffffffffe58);
      bVar1 = false;
      if ((local_1b8->is_container & 1U) != 0) {
        local_1c0._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffce8,(key_type *)0x1e3dab);
        local_1c8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffce8);
        bVar1 = std::__detail::operator!=(&local_1c0,&local_1c8);
      }
      if (bVar1 == false) {
        (anonymous_namespace)::format_description_abi_cxx11_(o_00,start,(size_t)width._M_current);
        ppVar5 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&stack0xfffffffffffffe68);
        std::__cxx11::string::operator+=((string *)in_RDI,(string *)ppVar5);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&stack0xfffffffffffffe68);
        sVar6 = stringLength((String *)0x1e3e62);
        if (local_60[0] < sVar6) {
          std::__cxx11::string::operator+=((string *)in_RDI,'\n');
          uVar2 = local_60[0] + 2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_228,uVar2,' ',(allocator *)(local_250 + 0x27));
          toLocalString<std::__cxx11::string>(&in_stack_fffffffffffffce8->first);
          std::__cxx11::string::operator+=((string *)in_RDI,local_208);
          std::__cxx11::string::~string(local_208);
          std::__cxx11::string::~string(local_228);
          std::allocator<char>::~allocator((allocator<char> *)(local_250 + 0x27));
        }
        else {
          in_stack_fffffffffffffd00 =
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_60[0] + 2);
          __gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&stack0xfffffffffffffe68);
          sVar6 = stringLength((String *)0x1e3fc0);
          in_stack_fffffffffffffcf0 =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)in_stack_fffffffffffffd00 - sVar6);
          paVar7 = &local_271;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_270,(ulong)in_stack_fffffffffffffcf0,' ',paVar7);
          in_stack_fffffffffffffce8 = (value_type *)local_250;
          toLocalString<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffce8);
          std::__cxx11::string::operator+=((string *)in_RDI,(string *)in_stack_fffffffffffffce8);
          std::__cxx11::string::~string((string *)local_250);
          std::__cxx11::string::~string(local_270);
          std::allocator<char>::~allocator((allocator<char> *)&local_271);
        }
        std::__cxx11::string::operator+=((string *)in_RDI,local_1e8);
        std::__cxx11::string::operator+=((string *)in_RDI,'\n');
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&stack0xfffffffffffffe68);
        std::__cxx11::string::~string(local_1e8);
      }
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++((__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                    *)&stack0xfffffffffffffe58);
    }
    local_61 = 1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(in_stack_fffffffffffffd00);
  }
  return in_RDI;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}